

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGenerator.cpp
# Opt level: O3

Deck * __thiscall
solitaire::cards::ShuffledDeckGenerator::generateSortedDeck
          (Deck *__return_storage_ptr__,ShuffledDeckGenerator *this)

{
  Value *pVVar1;
  Suit *pSVar2;
  ulong uVar3;
  Value *value;
  Value *pVVar4;
  long lVar5;
  Suit *suit;
  Suit *pSVar6;
  Card local_38;
  
  lVar5 = 0;
  do {
    Card::Card((Card *)(&__return_storage_ptr__->field_0x0 + lVar5));
    pSVar2 = DAT_00116278;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x1a0);
  if (suits != DAT_00116278) {
    uVar3 = 0;
    pVVar4 = values;
    pVVar1 = DAT_00116260;
    pSVar6 = suits;
    do {
      for (; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
        Card::Card(&local_38,*pVVar4,*pSVar6);
        *(Card *)(&__return_storage_ptr__->field_0x0 + uVar3 * 8) = local_38;
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      pSVar6 = pSVar6 + 1;
      pVVar4 = values;
      pVVar1 = DAT_00116260;
    } while (pSVar6 != pSVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Deck ShuffledDeckGenerator::generateSortedDeck() const {
    Deck generatedDeck;
    unsigned index = 0;
    for (const auto& suit: suits)
        for (const auto& value: values)
            generatedDeck[index++] = Card {value, suit};
    return generatedDeck;
}